

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O2

void PrintFinalStats(void *cvode_mem,int miter,sunrealtype ero)

{
  char *funcname;
  undefined4 local_9c;
  long nfeLS;
  long nje;
  long nsetups;
  long leniwLS;
  long lenrwLS;
  sunrealtype local_70;
  long netf;
  long nfe;
  long nst;
  long leniw;
  long lenrw;
  long ncfn;
  long nni;
  
  local_70 = ero;
  local_9c = CVodeGetWorkSpace(cvode_mem,&lenrw,&leniw);
  check_retval(&local_9c,"CVodeGetWorkSpace",1);
  local_9c = CVodeGetNumSteps(cvode_mem,&nst);
  check_retval(&local_9c,"CVodeGetNumSteps",1);
  local_9c = CVodeGetNumRhsEvals(cvode_mem,&nfe);
  check_retval(&local_9c,"CVodeGetNumRhsEvals",1);
  local_9c = CVodeGetNumLinSolvSetups(cvode_mem,&nsetups);
  check_retval(&local_9c,"CVodeGetNumLinSolvSetups",1);
  local_9c = CVodeGetNumErrTestFails(cvode_mem,&netf);
  check_retval(&local_9c,"CVodeGetNumErrTestFails",1);
  local_9c = CVodeGetNumNonlinSolvIters(cvode_mem,&nni);
  check_retval(&local_9c,"CVodeGetNumNonlinSolvIters",1);
  local_9c = CVodeGetNumNonlinSolvConvFails(cvode_mem,&ncfn);
  check_retval(&local_9c,"CVodeGetNumNonlinSolvConvFails",1);
  puts("\n Final statistics for this run:\n");
  printf(" CVode real workspace length              = %4ld \n",lenrw);
  printf(" CVode integer workspace length           = %4ld \n",leniw);
  printf(" Number of steps                          = %4ld \n",nst);
  printf(" Number of f-s                            = %4ld \n",nfe);
  printf(" Number of setups                         = %4ld \n",nsetups);
  printf(" Number of nonlinear iterations           = %4ld \n",nni);
  printf(" Number of nonlinear convergence failures = %4ld \n",ncfn);
  printf(" Number of error test failures            = %4ld \n\n",netf);
  if (miter != 0) {
    if (miter == 3) {
      nje = nsetups;
      local_9c = CVDiagGetNumRhsEvals(cvode_mem,&nfeLS);
      check_retval(&local_9c,"CVDiagGetNumRhsEvals",1);
      local_9c = CVDiagGetWorkSpace(cvode_mem,&lenrwLS,&leniwLS);
      funcname = "CVDiagGetWorkSpace";
    }
    else {
      local_9c = CVodeGetNumJacEvals(cvode_mem,&nje);
      check_retval(&local_9c,"CVodeGetNumJacEvals",1);
      local_9c = CVodeGetNumLinRhsEvals(cvode_mem,&nfeLS);
      check_retval(&local_9c,"CVodeGetNumLinRhsEvals",1);
      local_9c = CVodeGetLinWorkSpace(cvode_mem,&lenrwLS,&leniwLS);
      funcname = "CVodeGetLinWorkSpace";
    }
    check_retval(&local_9c,funcname,1);
    printf(" Linear solver real workspace length      = %4ld \n",lenrwLS);
    printf(" Linear solver integer workspace length   = %4ld \n",leniwLS);
    printf(" Number of Jacobian evaluations           = %4ld \n",nje);
    printf(" Number of f evals. in linear solver      = %4ld \n\n",nfeLS);
  }
  printf(" Error overrun = %.3f \n",local_70);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem, int miter, sunrealtype ero)
{
  long int lenrw, leniw, lenrwLS, leniwLS;
  long int nst, nfe, nsetups, nni, ncfn, netf, nje, nfeLS;
  int retval;

  retval = CVodeGetWorkSpace(cvode_mem, &lenrw, &leniw);
  check_retval(&retval, "CVodeGetWorkSpace", 1);
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  printf("\n Final statistics for this run:\n\n");
  printf(" CVode real workspace length              = %4ld \n", lenrw);
  printf(" CVode integer workspace length           = %4ld \n", leniw);
  printf(" Number of steps                          = %4ld \n", nst);
  printf(" Number of f-s                            = %4ld \n", nfe);
  printf(" Number of setups                         = %4ld \n", nsetups);
  printf(" Number of nonlinear iterations           = %4ld \n", nni);
  printf(" Number of nonlinear convergence failures = %4ld \n", ncfn);
  printf(" Number of error test failures            = %4ld \n\n", netf);

  if (miter != FUNC)
  {
    if (miter != DIAG)
    {
      retval = CVodeGetNumJacEvals(cvode_mem, &nje);
      check_retval(&retval, "CVodeGetNumJacEvals", 1);
      retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
      check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);
      retval = CVodeGetLinWorkSpace(cvode_mem, &lenrwLS, &leniwLS);
      check_retval(&retval, "CVodeGetLinWorkSpace", 1);
    }
    else
    {
      nje    = nsetups;
      retval = CVDiagGetNumRhsEvals(cvode_mem, &nfeLS);
      check_retval(&retval, "CVDiagGetNumRhsEvals", 1);
      retval = CVDiagGetWorkSpace(cvode_mem, &lenrwLS, &leniwLS);
      check_retval(&retval, "CVDiagGetWorkSpace", 1);
    }
    printf(" Linear solver real workspace length      = %4ld \n", lenrwLS);
    printf(" Linear solver integer workspace length   = %4ld \n", leniwLS);
    printf(" Number of Jacobian evaluations           = %4ld \n", nje);
    printf(" Number of f evals. in linear solver      = %4ld \n\n", nfeLS);
  }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf(" Error overrun = %.3Lf \n", ero);
#else
  printf(" Error overrun = %.3f \n", ero);
#endif
}